

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::Destroy(RTPUDPv4Transmitter *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTPUDPv4Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    if (this->localhostname != (uint8_t *)0x0) {
      buf = this->localhostname;
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(buf,mgr);
      this->localhostname = (uint8_t *)0x0;
      this->localhostnamelength = 0;
    }
    if ((this->closesocketswhendone & 1U) != 0) {
      if (this->rtpsock != this->rtcpsock) {
        close(this->rtcpsock);
      }
      close(this->rtpsock);
    }
    RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
    ::Clear(&this->destinations);
    RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::Clear
              (&this->multicastgroups);
    FlushPackets(this);
    ClearAcceptIgnoreInfo(this);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->localIPs);
    this->created = false;
    if ((this->waitingfordata & 1U) == 0) {
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
    else {
      RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::Destroy()
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	if (localhostname)
	{
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		localhostname = 0;
		localhostnamelength = 0;
	}
	
	CLOSESOCKETS;
	destinations.Clear();
#ifdef RTP_SUPPORT_IPV4MULTICAST
	multicastgroups.Clear();
#endif // RTP_SUPPORT_IPV4MULTICAST
	FlushPackets();
	ClearAcceptIgnoreInfo();
	localIPs.clear();
	created = false;
	
	if (waitingfordata)
	{
		m_pAbortDesc->SendAbortSignal();
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized

	MAINMUTEX_UNLOCK
}